

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

_Bool store_get_check(char *prompt)

{
  char *pcVar1;
  keypress kVar2;
  keycode_t kStack_20;
  keypress ch;
  char *prompt_local;
  
  prt(prompt,L'\0',L'\0');
  kVar2 = inkey();
  prt("",L'\0',L'\0');
  kStack_20 = kVar2.code;
  if (kStack_20 == 0xe000) {
    prompt_local._7_1_ = false;
  }
  else {
    pcVar1 = strchr("Nn",kStack_20);
    if (pcVar1 == (char *)0x0) {
      prompt_local._7_1_ = true;
    }
    else {
      prompt_local._7_1_ = false;
    }
  }
  return prompt_local._7_1_;
}

Assistant:

static bool store_get_check(const char *prompt)
{
	struct keypress ch;

	/* Prompt for it */
	prt(prompt, 0, 0);

	/* Get an answer */
	ch = inkey();

	/* Erase the prompt */
	prt("", 0, 0);

	if (ch.code == ESCAPE) return (false);
	if (strchr("Nn", ch.code)) return (false);

	/* Success */
	return (true);
}